

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

void __thiscall icu_63::CollationRuleParser::setErrorContext(CollationRuleParser *this)

{
  short sVar1;
  int iVar2;
  UParseError *pUVar3;
  UnicodeString *pUVar4;
  char16_t *pcVar5;
  uint uVar6;
  uint uVar7;
  
  pUVar3 = this->parseError;
  if (pUVar3 != (UParseError *)0x0) {
    iVar2 = this->ruleIndex;
    pUVar3->offset = iVar2;
    pUVar3->line = 0;
    pUVar4 = this->rules;
    uVar6 = 0;
    if (0xf < iVar2) {
      uVar6 = iVar2 - 0xf;
      sVar1 = (pUVar4->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar7 = (pUVar4->fUnion).fFields.fLength;
      }
      else {
        uVar7 = (int)sVar1 >> 5;
      }
      if (uVar6 < uVar7) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar5 = (pUVar4->fUnion).fFields.fArray;
        }
        else {
          pcVar5 = (char16_t *)((long)&pUVar4->fUnion + 2);
        }
        if ((pcVar5[uVar6] & 0xfc00U) == 0xdc00) {
          uVar6 = iVar2 - 0xe;
        }
      }
    }
    UnicodeString::doExtract(pUVar4,uVar6,iVar2 - uVar6,pUVar3->preContext,0);
    pUVar3 = this->parseError;
    pUVar3->preContext[(int)(iVar2 - uVar6)] = L'\0';
    pUVar4 = this->rules;
    sVar1 = (pUVar4->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar6 = (pUVar4->fUnion).fFields.fLength;
    }
    else {
      uVar6 = (int)sVar1 >> 5;
    }
    iVar2 = this->ruleIndex;
    uVar7 = uVar6 - iVar2;
    if ((0xf < (int)uVar7) && (uVar7 = 0xf, iVar2 + 0xeU < uVar6)) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (pUVar4->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&pUVar4->fUnion + 2);
      }
      uVar7 = (pcVar5[(long)iVar2 + 0xe] & 0xfc00U) == 0xd800 ^ 0xf;
    }
    UnicodeString::doExtract(pUVar4,iVar2,uVar7,pUVar3->postContext,0);
    this->parseError->postContext[(int)uVar7] = L'\0';
  }
  return;
}

Assistant:

void
CollationRuleParser::setErrorContext() {
    if(parseError == NULL) { return; }

    // Note: This relies on the calling code maintaining the ruleIndex
    // at a position that is useful for debugging.
    // For example, at the beginning of a reset or relation etc.
    parseError->offset = ruleIndex;
    parseError->line = 0;  // We are not counting line numbers.

    // before ruleIndex
    int32_t start = ruleIndex - (U_PARSE_CONTEXT_LEN - 1);
    if(start < 0) {
        start = 0;
    } else if(start > 0 && U16_IS_TRAIL(rules->charAt(start))) {
        ++start;
    }
    int32_t length = ruleIndex - start;
    rules->extract(start, length, parseError->preContext);
    parseError->preContext[length] = 0;

    // starting from ruleIndex
    length = rules->length() - ruleIndex;
    if(length >= U_PARSE_CONTEXT_LEN) {
        length = U_PARSE_CONTEXT_LEN - 1;
        if(U16_IS_LEAD(rules->charAt(ruleIndex + length - 1))) {
            --length;
        }
    }
    rules->extract(ruleIndex, length, parseError->postContext);
    parseError->postContext[length] = 0;
}